

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O3

int Test_SUNMatScaleAddI(SUNMatrix A,SUNMatrix I,int myid)

{
  uint uVar1;
  int iVar2;
  SUNMatrix A_00;
  char *__format;
  
  A_00 = (SUNMatrix)SUNMatClone();
  uVar1 = SUNMatCopy(I,A_00);
  if (uVar1 == 0) {
    uVar1 = SUNMatScaleAddI(0xbff0000000000000,A_00);
    sync_device(A_00);
    if (uVar1 == 0) {
      iVar2 = check_matrix_entry(A_00,0.0,2.220446049250313e-15);
      if (iVar2 == 0) {
        if (print_all_ranks == 0 && myid == 0) {
LAB_00102580:
          puts("    PASSED test -- SUNMatScaleAddI ");
        }
        else if (print_all_ranks != 0) {
          printf("process %06d: ",(ulong)(uint)myid);
          goto LAB_00102580;
        }
        iVar2 = 0;
        if (myid != 0) goto LAB_0010250b;
      }
      else {
        if (print_all_ranks == 0 && myid == 0) {
LAB_00102552:
          puts(">>> FAILED test -- SUNMatScaleAddI check ");
        }
        else if (print_all_ranks != 0) {
          printf("process %06d: ",(ulong)(uint)myid);
          goto LAB_00102552;
        }
        iVar2 = 1;
      }
      if (print_time != 0) {
        printf("    SUNMatScaleAddI Time: %22.15e \n \n",0);
      }
      goto LAB_0010250b;
    }
    if (print_all_ranks != 0 || myid != 0) {
      if (print_all_ranks == 0) goto LAB_00102505;
      printf("process %06d: ",(ulong)(uint)myid);
    }
    __format = ">>> FAILED test -- SUNMatScaleAddI returned %d \n";
LAB_001024fb:
    printf(__format,(ulong)uVar1);
  }
  else {
    if (print_all_ranks == 0 && myid == 0) {
LAB_001024ab:
      __format = ">>> FAILED test -- SUNMatCopy returned %d \n";
      goto LAB_001024fb;
    }
    if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)(uint)myid);
      goto LAB_001024ab;
    }
  }
LAB_00102505:
  iVar2 = 1;
LAB_0010250b:
  SUNMatDestroy(A_00);
  return iVar2;
}

Assistant:

int Test_SUNMatScaleAddI(SUNMatrix A, SUNMatrix I, int myid)
{
  int failure;
  double start_time, stop_time;
  SUNMatrix B;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;

  /* protect A */
  B = SUNMatClone(A);

  failure = SUNMatCopy(I, B);
  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* perform operation */
  start_time = get_time();
  failure    = SUNMatScaleAddI(NEG_ONE, B);
  sync_device(B);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure,
                 myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* check matrix */
  failure = check_matrix_entry(B, ZERO, tol);

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatScaleAddI check \n", myid);
    PRINT_TIME("    SUNMatScaleAddI Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatScaleAddI \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatScaleAddI Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return (0);
}